

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BayesianProbitRegressor::BayesianProbitRegressor
          (BayesianProbitRegressor *this,BayesianProbitRegressor *from)

{
  InternalMetadata *this_00;
  BayesianProbitRegressor_Gaussian *from_00;
  BayesianProbitRegressor_Gaussian *this_01;
  undefined8 *puVar1;
  ulong uVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__BayesianProbitRegressor_00405838
  ;
  google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::
  RepeatedPtrField(&this->features_,&from->features_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (this_00,&(from->super_MessageLite)._internal_metadata_);
  (this->regressioninputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->regressioninputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->regressioninputfeaturename_,uVar2,puVar1)
    ;
  }
  (this->optimisminputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->optimisminputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->optimisminputfeaturename_,uVar2,puVar1);
  }
  (this->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->samplingscaleinputfeaturename_,uVar2,puVar1);
  }
  (this->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->samplingtruncationinputfeaturename_,uVar2,puVar1);
  }
  (this->meanoutputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->meanoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->meanoutputfeaturename_,uVar2,puVar1);
  }
  (this->varianceoutputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->varianceoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->varianceoutputfeaturename_,uVar2,puVar1);
  }
  (this->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
          0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->pessimisticprobabilityoutputfeaturename_,uVar2,puVar1);
  }
  (this->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->sampledprobabilityoutputfeaturename_,uVar2,puVar1);
  }
  from_00 = from->bias_;
  if (from_00 == (BayesianProbitRegressor_Gaussian *)0x0 ||
      from == (BayesianProbitRegressor *)_BayesianProbitRegressor_default_instance_) {
    this_01 = (BayesianProbitRegressor_Gaussian *)0x0;
  }
  else {
    this_01 = (BayesianProbitRegressor_Gaussian *)operator_new(0x28);
    BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(this_01,from_00);
  }
  this->bias_ = this_01;
  this->numberoffeatures_ = from->numberoffeatures_;
  return;
}

Assistant:

BayesianProbitRegressor::BayesianProbitRegressor(const BayesianProbitRegressor& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      features_(from.features_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  regressioninputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    regressioninputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_regressioninputfeaturename().empty()) {
    regressioninputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_regressioninputfeaturename(), 
      GetArenaForAllocation());
  }
  optimisminputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    optimisminputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_optimisminputfeaturename().empty()) {
    optimisminputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_optimisminputfeaturename(), 
      GetArenaForAllocation());
  }
  samplingscaleinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    samplingscaleinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_samplingscaleinputfeaturename().empty()) {
    samplingscaleinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_samplingscaleinputfeaturename(), 
      GetArenaForAllocation());
  }
  samplingtruncationinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    samplingtruncationinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_samplingtruncationinputfeaturename().empty()) {
    samplingtruncationinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_samplingtruncationinputfeaturename(), 
      GetArenaForAllocation());
  }
  meanoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    meanoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_meanoutputfeaturename().empty()) {
    meanoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_meanoutputfeaturename(), 
      GetArenaForAllocation());
  }
  varianceoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    varianceoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_varianceoutputfeaturename().empty()) {
    varianceoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_varianceoutputfeaturename(), 
      GetArenaForAllocation());
  }
  pessimisticprobabilityoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    pessimisticprobabilityoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_pessimisticprobabilityoutputfeaturename().empty()) {
    pessimisticprobabilityoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_pessimisticprobabilityoutputfeaturename(), 
      GetArenaForAllocation());
  }
  sampledprobabilityoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    sampledprobabilityoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_sampledprobabilityoutputfeaturename().empty()) {
    sampledprobabilityoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_sampledprobabilityoutputfeaturename(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_bias()) {
    bias_ = new ::CoreML::Specification::BayesianProbitRegressor_Gaussian(*from.bias_);
  } else {
    bias_ = nullptr;
  }
  numberoffeatures_ = from.numberoffeatures_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BayesianProbitRegressor)
}